

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O1

void handle_vec_simd_sqshrn
               (DisasContext_conflict1 *s,_Bool is_scalar,_Bool is_q,_Bool is_u_shift,
               _Bool is_u_narrow,int immh,int immb,int opcode,int rn,int rd)

{
  TCGContext_conflict1 *s_00;
  NeonGenNarrowEnvFn *pNVar1;
  TCGContext_conflict1 *tcg_ctx;
  int iVar2;
  NeonGenNarrowEnvFn **ppNVar3;
  TCGTemp *pTVar4;
  TCGTemp *pTVar5;
  TCGTemp *pTVar6;
  TCGv_i64 ret;
  byte bVar7;
  int shift;
  TCGv_i64 tcg_dest;
  uintptr_t o_2;
  TCGv_i64 tcg_res;
  uint uVar8;
  uint element;
  uintptr_t o_1;
  uint uVar9;
  TCGv_i32 arg;
  TCGv_i64 local_70;
  
  uVar8 = 0x20;
  if (immh != 0) {
    uVar8 = 0x1f;
    if (immh != 0) {
      for (; (uint)immh >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = uVar8 ^ 0x1f;
  }
  iVar2 = 0x1f - uVar8;
  bVar7 = 0x22 - (char)uVar8;
  uVar9 = 1;
  if (!is_scalar) {
    uVar9 = 0x40 >> (bVar7 & 0x1f);
  }
  if (0xf < (uint)immh) {
    __assert_fail("size < 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                  ,0x20ff,
                  "void handle_vec_simd_sqshrn(DisasContext *, _Bool, _Bool, _Bool, _Bool, int, int, int, int, int)"
                 );
  }
  if (7 < (uint)immh) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (s->fp_access_checked != true) {
    s_00 = s->uc->tcg_ctx;
    s->fp_access_checked = true;
    if (s->fp_excp_el != 0) {
      gen_exception_insn(s,s->pc_curr,1,0x1fe0000a,s->fp_excp_el);
      return;
    }
    shift = (0x10 << ((byte)iVar2 & 0x1f)) - (immh << 3 | immb);
    ppNVar3 = handle_vec_simd_sqshrn::signed_narrow_fns[iVar2] + is_u_narrow;
    if (is_u_shift) {
      ppNVar3 = handle_vec_simd_sqshrn::unsigned_narrow_fns + iVar2;
    }
    local_70 = (TCGv_i64)0x0;
    pTVar4 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    pTVar5 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I64,false);
    pTVar6 = tcg_temp_new_internal_aarch64(s_00,TCG_TYPE_I32,false);
    ret = tcg_const_i64_aarch64(s_00,0);
    pNVar1 = *ppNVar3;
    if ((opcode & 1U) != 0) {
      local_70 = tcg_const_i64_aarch64(s_00,1L << ((char)shift - 1U & 0x3f));
    }
    tcg_dest = (TCGv_i64)((long)pTVar4 - (long)s_00);
    tcg_res = (TCGv_i64)((long)pTVar5 - (long)s_00);
    arg = (TCGv_i32)((long)pTVar6 - (long)s_00);
    if (uVar9 != 0) {
      element = 0;
      do {
        read_vec_element(s,tcg_dest,rn,element,(uint)!is_u_shift << 2 | MO_ALIGN_4 - uVar8);
        handle_shri_with_rndacc
                  (s_00,tcg_res,tcg_dest,local_70,false,is_u_shift,MO_ALIGN_4 - uVar8,shift);
        (*pNVar1)(s_00,arg,s_00->cpu_env,tcg_res);
        tcg_gen_extu_i32_i64_aarch64(s_00,tcg_res,arg);
        tcg_gen_deposit_i64_aarch64
                  (s_00,ret,ret,tcg_res,element << (bVar7 & 0x1f),8 << ((byte)iVar2 & 0x1f));
        element = element + 1;
      } while (uVar9 != element);
    }
    tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i64,(TCGArg)(ret + (long)&tcg_ctx->pool_cur),
                        (TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx),
                        (long)(int)(rd * 0x100 + (uint)is_q * 8 + 0xc10));
    if ((opcode & 1U) != 0) {
      tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(local_70 + (long)s_00));
    }
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_dest + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(tcg_res + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(arg + (long)s_00));
    tcg_temp_free_internal_aarch64(s_00,(TCGTemp *)(ret + (long)s_00));
    clear_vec_high(s,is_q,rd);
    return;
  }
  __assert_fail("!s->fp_access_checked",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                ,0x487,"_Bool fp_access_check(DisasContext *)");
}

Assistant:

static void handle_vec_simd_sqshrn(DisasContext *s, bool is_scalar, bool is_q,
                                   bool is_u_shift, bool is_u_narrow,
                                   int immh, int immb, int opcode,
                                   int rn, int rd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int immhb = immh << 3 | immb;
    int size = 32 - clz32(immh) - 1;
    int esize = 8 << size;
    int shift = (2 * esize) - immhb;
    int elements = is_scalar ? 1 : (64 / esize);
    bool round = extract32(opcode, 0, 1);
    MemOp ldop = (size + 1) | (is_u_shift ? 0 : MO_SIGN);
    TCGv_i64 tcg_rn, tcg_rd, tcg_round;
    TCGv_i32 tcg_rd_narrowed;
    TCGv_i64 tcg_final;

    static NeonGenNarrowEnvFn * const signed_narrow_fns[4][2] = {
        { gen_helper_neon_narrow_sat_s8,
          gen_helper_neon_unarrow_sat8 },
        { gen_helper_neon_narrow_sat_s16,
          gen_helper_neon_unarrow_sat16 },
        { gen_helper_neon_narrow_sat_s32,
          gen_helper_neon_unarrow_sat32 },
        { NULL, NULL },
    };
    static NeonGenNarrowEnvFn * const unsigned_narrow_fns[4] = {
        gen_helper_neon_narrow_sat_u8,
        gen_helper_neon_narrow_sat_u16,
        gen_helper_neon_narrow_sat_u32,
        NULL
    };
    NeonGenNarrowEnvFn *narrowfn;

    int i;

    assert(size < 4);

    if (extract32(immh, 3, 1)) {
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_u_shift) {
        narrowfn = unsigned_narrow_fns[size];
    } else {
        narrowfn = signed_narrow_fns[size][is_u_narrow ? 1 : 0];
    }

    tcg_rn = tcg_temp_new_i64(tcg_ctx);
    tcg_rd = tcg_temp_new_i64(tcg_ctx);
    tcg_rd_narrowed = tcg_temp_new_i32(tcg_ctx);
    tcg_final = tcg_const_i64(tcg_ctx, 0);

    if (round) {
        uint64_t round_const = 1ULL << (shift - 1);
        tcg_round = tcg_const_i64(tcg_ctx, round_const);
    } else {
        tcg_round = NULL;
    }

    for (i = 0; i < elements; i++) {
        read_vec_element(s, tcg_rn, rn, i, ldop);
        handle_shri_with_rndacc(tcg_ctx, tcg_rd, tcg_rn, tcg_round,
                                false, is_u_shift, size+1, shift);
        narrowfn(tcg_ctx, tcg_rd_narrowed, tcg_ctx->cpu_env, tcg_rd);
        tcg_gen_extu_i32_i64(tcg_ctx, tcg_rd, tcg_rd_narrowed);
        tcg_gen_deposit_i64(tcg_ctx, tcg_final, tcg_final, tcg_rd, esize * i, esize);
    }

    if (!is_q) {
        write_vec_element(s, tcg_final, rd, 0, MO_64);
    } else {
        write_vec_element(s, tcg_final, rd, 1, MO_64);
    }

    if (round) {
        tcg_temp_free_i64(tcg_ctx, tcg_round);
    }
    tcg_temp_free_i64(tcg_ctx, tcg_rn);
    tcg_temp_free_i64(tcg_ctx, tcg_rd);
    tcg_temp_free_i32(tcg_ctx, tcg_rd_narrowed);
    tcg_temp_free_i64(tcg_ctx, tcg_final);

    clear_vec_high(s, is_q, rd);
}